

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brng.c
# Opt level: O3

void brngCTRStepR(void *buf,size_t count,void *state)

{
  size_t *psVar1;
  void *pvVar2;
  long *plVar3;
  ulong *puVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  word *w;
  void *buf_00;
  size_t count_00;
  
  psVar1 = (size_t *)((long)state + 0x60);
  uVar7 = *(ulong *)((long)state + 0x60);
  if (uVar7 != 0) {
    if (count <= uVar7) {
      memCopy(buf,(void *)((long)psVar1 - uVar7),count);
      count_00 = *psVar1 - count;
      goto LAB_00133a6a;
    }
    memCopy(buf,(void *)((long)psVar1 - uVar7),uVar7);
    count = count - *psVar1;
    buf = (void *)((long)buf + *psVar1);
    *psVar1 = 0;
  }
  if (0x1f < count) {
    pvVar2 = (void *)((long)state + 0x68);
    do {
      sVar5 = beltHash_keep();
      sVar6 = beltHash_keep();
      memCopy(pvVar2,(void *)(sVar5 + (long)pvVar2),sVar6);
      beltHashStepH(state,0x20,pvVar2);
      beltHashStepH(buf,0x20,pvVar2);
      beltHashStepH((void *)((long)state + 0x20),0x20,pvVar2);
      beltHashStepG((octet *)buf,pvVar2);
      uVar7 = 0;
      do {
        plVar3 = (long *)((long)state + uVar7 * 8);
        *plVar3 = *plVar3 + 1;
        if (3 < uVar7) break;
        uVar7 = uVar7 + 1;
      } while (*plVar3 == 0);
      lVar8 = 7;
      do {
        puVar4 = (ulong *)((long)state + lVar8 * 8);
        *puVar4 = *puVar4 ^ *(ulong *)((long)buf + lVar8 * 8 + -0x20);
        lVar8 = lVar8 + -1;
      } while (lVar8 != 3);
      buf = (void *)((long)buf + 0x20);
      count = count - 0x20;
    } while (0x1f < count);
  }
  if (count == 0) {
    return;
  }
  buf_00 = (void *)((long)state + count + 0x40);
  count_00 = 0x20 - count;
  uVar7 = 0;
  memSet(buf_00,'\0',count_00);
  pvVar2 = (void *)((long)state + 0x68);
  sVar5 = beltHash_keep();
  sVar6 = beltHash_keep();
  memCopy(pvVar2,(void *)((long)state + sVar5 + 0x68),sVar6);
  beltHashStepH(state,0x20,pvVar2);
  beltHashStepH(buf,count,pvVar2);
  beltHashStepH(buf_00,count_00,pvVar2);
  beltHashStepH((void *)((long)state + 0x20),0x20,pvVar2);
  beltHashStepG((octet *)((long)state + 0x40),pvVar2);
  memCopy(buf,(octet *)((long)state + 0x40),count);
  do {
    plVar3 = (long *)((long)state + uVar7 * 8);
    *plVar3 = *plVar3 + 1;
    if (3 < uVar7) break;
    uVar7 = uVar7 + 1;
  } while (*plVar3 == 0);
  *(uint *)((long)state + 0x30) = *(uint *)((long)state + 0x50) ^ *(uint *)((long)state + 0x30);
  *(uint *)((long)state + 0x34) = *(uint *)((long)state + 0x54) ^ *(uint *)((long)state + 0x34);
  *(uint *)((long)state + 0x38) = *(uint *)((long)state + 0x58) ^ *(uint *)((long)state + 0x38);
  *(uint *)((long)state + 0x3c) = *(uint *)((long)state + 0x5c) ^ *(uint *)((long)state + 0x3c);
  *(uint *)((long)state + 0x20) = *(uint *)((long)state + 0x40) ^ *(uint *)((long)state + 0x20);
  *(uint *)((long)state + 0x24) = *(uint *)((long)state + 0x44) ^ *(uint *)((long)state + 0x24);
  *(uint *)((long)state + 0x28) = *(uint *)((long)state + 0x48) ^ *(uint *)((long)state + 0x28);
  *(uint *)((long)state + 0x2c) = *(uint *)((long)state + 0x4c) ^ *(uint *)((long)state + 0x2c);
LAB_00133a6a:
  *psVar1 = count_00;
  return;
}

Assistant:

void brngCTRStepR(void* buf, size_t count, void* state)
{
	brng_ctr_st* s = (brng_ctr_st*)state;
	ASSERT(memIsDisjoint2(buf, count, s, brngCTR_keep()));
	// есть резерв данных?
	if (s->reserved)
	{
		if (s->reserved >= count)
		{
			memCopy(buf, s->block + 32 - s->reserved, count);
			s->reserved -= count;
			return;
		}
		memCopy(buf, s->block + 32 - s->reserved, s->reserved);
		count -= s->reserved;
		buf = (octet*)buf + s->reserved;
		s->reserved = 0;
	}
	// цикл по полным блокам
	while (count >= 32)
	{
		// Y_t <- belt-hash(key || s || X_t || r)
		memCopy(s->state_ex, s->state_ex + beltHash_keep(), beltHash_keep());
		beltHashStepH(s->s, 32, s->state_ex);
		beltHashStepH(buf, 32, s->state_ex);
		beltHashStepH(s->r, 32, s->state_ex);
		beltHashStepG(buf, s->state_ex);
		// next
		brngBlockInc(s->s);
		brngBlockXor2(s->r, buf);
		buf = (octet*)buf + 32;
		count -= 32;
	}
	// неполный блок?
	if (count)
	{
		// block <- beltHash(key || s || zero_pad(X_t) || r)
		memSetZero(s->block + count, 32 - count);
		memCopy(s->state_ex, s->state_ex + beltHash_keep(), beltHash_keep());
		beltHashStepH(s->s, 32, s->state_ex);
		beltHashStepH(buf, count, s->state_ex);
		beltHashStepH(s->block + count, 32 - count, s->state_ex);
		beltHashStepH(s->r, 32, s->state_ex);
		beltHashStepG(s->block, s->state_ex);
		// Y_t <- left(block)
		memCopy(buf, s->block, count);
		// next
		brngBlockInc(s->s);
		brngBlockXor2(s->r, s->block);
		s->reserved = 32 - count;
	}
}